

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSResolveResultEnum
js_resolve_export1(JSContext *ctx,JSModuleDef **pmodule,JSExportEntry **pme,JSModuleDef *m,
                  JSAtom export_name,JSResolveState *s)

{
  JSResolveEntry *pJVar1;
  JSAtomStruct *pJVar2;
  int iVar3;
  JSResolveResultEnum JVar4;
  JSExportEntry *pJVar5;
  long lVar6;
  JSAtom export_name_00;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  JSExportEntry *local_40;
  JSModuleDef *local_38;
  
  uVar7 = (ulong)export_name;
  uVar9 = s->count;
  while( true ) {
    *pmodule = (JSModuleDef *)0x0;
    *pme = (JSExportEntry *)0x0;
    export_name_00 = (JSAtom)uVar7;
    if (0 < (int)uVar9) {
      lVar6 = 0;
      do {
        if ((*(JSModuleDef **)((long)&s->array->module + lVar6) == m) &&
           (*(JSAtom *)((long)&s->array->name + lVar6) == export_name_00)) {
          return JS_RESOLVE_RES_CIRCULAR;
        }
        lVar6 = lVar6 + 0x10;
      } while ((ulong)uVar9 << 4 != lVar6);
    }
    uVar8 = uVar9;
    if (s->size <= (int)uVar9) {
      iVar3 = js_realloc_array(ctx,&s->array,0x10,&s->size,uVar9 + 1);
      if (iVar3 != 0) {
        return JS_RESOLVE_RES_EXCEPTION;
      }
      uVar8 = s->count;
    }
    pJVar1 = s->array;
    uVar9 = uVar8 + 1;
    s->count = uVar9;
    pJVar1[(int)uVar8].module = m;
    if (0xd1 < (int)export_name_00) {
      pJVar2 = ctx->rt->atom_array[uVar7];
      (pJVar2->header).ref_count = (pJVar2->header).ref_count + 1;
    }
    pJVar1[(int)uVar8].name = export_name_00;
    lVar6 = (long)m->export_entries_count;
    if (lVar6 < 1) break;
    pJVar5 = m->export_entries;
    while (pJVar5->export_name != export_name_00) {
      pJVar5 = pJVar5 + 1;
      lVar6 = lVar6 + -1;
      if (lVar6 == 0) goto LAB_001354ea;
    }
    if ((pJVar5->export_type == JS_EXPORT_TYPE_LOCAL) ||
       (uVar7 = (ulong)pJVar5->local_name, pJVar5->local_name == 0x7d)) {
      *pmodule = m;
      *pme = pJVar5;
      return JS_RESOLVE_RES_FOUND;
    }
    m = m->req_module_entries[(pJVar5->u).local.var_idx].module;
  }
LAB_001354ea:
  if (export_name_00 != 0x16) {
    if (0 < m->star_export_entries_count) {
      lVar6 = 0;
      do {
        JVar4 = js_resolve_export1(ctx,&local_38,&local_40,
                                   m->req_module_entries
                                   [m->star_export_entries[lVar6].req_module_idx].module,
                                   export_name_00,s);
        if (JVar4 == JS_RESOLVE_RES_FOUND) {
          if (*pme == (JSExportEntry *)0x0) {
            *pmodule = local_38;
            *pme = local_40;
          }
          else if ((*pmodule != local_38) || (local_40->local_name != (*pme)->local_name)) {
            *pmodule = (JSModuleDef *)0x0;
            *pme = (JSExportEntry *)0x0;
            return JS_RESOLVE_RES_AMBIGUOUS;
          }
        }
        else {
          if (JVar4 == JS_RESOLVE_RES_EXCEPTION) {
            return JS_RESOLVE_RES_EXCEPTION;
          }
          if (JVar4 == JS_RESOLVE_RES_AMBIGUOUS) {
            return JS_RESOLVE_RES_AMBIGUOUS;
          }
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < m->star_export_entries_count);
    }
    if (*pme != (JSExportEntry *)0x0) {
      return JS_RESOLVE_RES_FOUND;
    }
  }
  return JS_RESOLVE_RES_NOT_FOUND;
}

Assistant:

static JSResolveResultEnum js_resolve_export1(JSContext *ctx,
                                              JSModuleDef **pmodule,
                                              JSExportEntry **pme,
                                              JSModuleDef *m,
                                              JSAtom export_name,
                                              JSResolveState *s)
{
    JSExportEntry *me;

    *pmodule = NULL;
    *pme = NULL;
    if (find_resolve_entry(s, m, export_name) >= 0)
        return JS_RESOLVE_RES_CIRCULAR;
    if (add_resolve_entry(ctx, s, m, export_name) < 0)
        return JS_RESOLVE_RES_EXCEPTION;
    me = find_export_entry(ctx, m, export_name);
    if (me) {
        if (me->export_type == JS_EXPORT_TYPE_LOCAL) {
            /* local export */
            *pmodule = m;
            *pme = me;
            return JS_RESOLVE_RES_FOUND;
        } else {
            /* indirect export */
            JSModuleDef *m1;
            m1 = m->req_module_entries[me->u.req_module_idx].module;
            if (me->local_name == JS_ATOM__star_) {
                /* export ns from */
                *pmodule = m;
                *pme = me;
                return JS_RESOLVE_RES_FOUND;
            } else {
                return js_resolve_export1(ctx, pmodule, pme, m1,
                                          me->local_name, s);
            }
        }
    } else {
        if (export_name != JS_ATOM_default) {
            /* not found in direct or indirect exports: try star exports */
            int i;

            for(i = 0; i < m->star_export_entries_count; i++) {
                JSStarExportEntry *se = &m->star_export_entries[i];
                JSModuleDef *m1, *res_m;
                JSExportEntry *res_me;
                JSResolveResultEnum ret;

                m1 = m->req_module_entries[se->req_module_idx].module;
                ret = js_resolve_export1(ctx, &res_m, &res_me, m1,
                                         export_name, s);
                if (ret == JS_RESOLVE_RES_AMBIGUOUS ||
                    ret == JS_RESOLVE_RES_EXCEPTION) {
                    return ret;
                } else if (ret == JS_RESOLVE_RES_FOUND) {
                    if (*pme != NULL) {
                        if (*pmodule != res_m ||
                            res_me->local_name != (*pme)->local_name) {
                            *pmodule = NULL;
                            *pme = NULL;
                            return JS_RESOLVE_RES_AMBIGUOUS;
                        }
                    } else {
                        *pmodule = res_m;
                        *pme = res_me;
                    }
                }
            }
            if (*pme != NULL)
                return JS_RESOLVE_RES_FOUND;
        }
        return JS_RESOLVE_RES_NOT_FOUND;
    }
}